

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O1

unique_ptr<cmCommand,_std::default_delete<cmCommand>_> __thiscall
cmCTestSubmitCommand::Clone(cmCTestSubmitCommand *this)

{
  _func_int **__s;
  long in_RSI;
  
  __s = (_func_int **)operator_new(0x278);
  memset(__s,0,0x278);
  *__s = (_func_int *)&PTR__cmCTestHandlerCommand_009c4318;
  __s[0x13] = (_func_int *)0x0;
  __s[0x14] = (_func_int *)0x0;
  *(undefined8 *)((long)__s + 0xa2) = 0;
  *(undefined8 *)((long)__s + 0xaa) = 0;
  __s[0x17] = (_func_int *)(__s + 0x19);
  __s[0x18] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x19) = 0;
  __s[0x1b] = (_func_int *)(__s + 0x1d);
  __s[0x1c] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x1d) = 0;
  __s[0x1f] = (_func_int *)(__s + 0x21);
  __s[0x20] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x21) = 0;
  __s[0x23] = (_func_int *)(__s + 0x25);
  __s[0x24] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x25) = 0;
  __s[0x27] = (_func_int *)(__s + 0x29);
  __s[0x28] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x29) = 0;
  *__s = (_func_int *)&PTR__cmCTestSubmitCommand_009c30f8;
  *(undefined2 *)(__s + 0x2b) = 0;
  __s[0x2c] = (_func_int *)(__s + 0x2e);
  __s[0x2d] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x2e) = 0;
  __s[0x30] = (_func_int *)(__s + 0x32);
  __s[0x31] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x32) = 0;
  __s[0x34] = (_func_int *)(__s + 0x36);
  __s[0x35] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x36) = 0;
  __s[0x38] = (_func_int *)(__s + 0x3a);
  __s[0x39] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x3a) = 0;
  __s[0x3c] = (_func_int *)(__s + 0x3e);
  __s[0x3d] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x3e) = 0;
  __s[0x40] = (_func_int *)(__s + 0x42);
  __s[0x41] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x42) = 0;
  *(undefined1 *)(__s + 0x47) = 0;
  __s[0x4a] = (_func_int *)0x0;
  __s[0x48] = (_func_int *)0x0;
  __s[0x49] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x4e) = 0;
  __s[3] = *(_func_int **)(in_RSI + 0x18);
  __s[4] = *(_func_int **)(in_RSI + 0x20);
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand = __s;
  return (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)
         (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCommand> cmCTestSubmitCommand::Clone()
{
  auto ni = cm::make_unique<cmCTestSubmitCommand>();
  ni->CTest = this->CTest;
  ni->CTestScriptHandler = this->CTestScriptHandler;
  return std::unique_ptr<cmCommand>(std::move(ni));
}